

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# symbols.cpp
# Opt level: O3

bool ast::case_insensitive_compare(Symbol *a,Symbol *b)

{
  ulong uVar1;
  pointer pcVar2;
  pointer pcVar3;
  bool bVar4;
  int iVar5;
  int iVar6;
  ulong uVar7;
  ulong uVar8;
  
  uVar1 = (a->name)._M_string_length;
  if (uVar1 != 0) {
    pcVar2 = (a->name)._M_dataplus._M_p;
    pcVar3 = (b->name)._M_dataplus._M_p;
    uVar7 = 0;
    uVar8 = 1;
    do {
      iVar5 = tolower((int)pcVar2[uVar7]);
      iVar6 = tolower((int)pcVar3[uVar7]);
      if (iVar5 != iVar6) {
        return iVar5 < iVar6;
      }
      bVar4 = uVar8 < uVar1;
      uVar7 = uVar8;
      uVar8 = (ulong)((int)uVar8 + 1);
    } while (bVar4);
  }
  return uVar1 < (b->name)._M_string_length;
}

Assistant:

static bool case_insensitive_compare(Symbol *a, Symbol *b)
{
	auto size = a->name.size();
	for (auto i = 0U; i < size; ++i) {
		auto char_a = tolower(a->name[i]);
		auto char_b = tolower(b->name[i]);
		if (char_a != char_b)
			return char_a < char_b;
	}
	return a->name.size() < b->name.size();
}